

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

BOOL __thiscall Js::FunctionBody::IsInterpreterThunk(FunctionBody *this)

{
  BOOL BVar1;
  JavascriptMethod p_Var2;
  JavascriptMethod p_Var3;
  bool local_13;
  bool isStaticInterpreterThunk;
  bool isInterpreterThunk;
  FunctionBody *this_local;
  
  p_Var2 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
  p_Var3 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
  local_13 = true;
  if ((p_Var2 != InterpreterStackFrame::DelayDynamicInterpreterThunk) &&
     (local_13 = true, p_Var3 != InterpreterStackFrame::StaticInterpreterThunk)) {
    BVar1 = IsDynamicInterpreterThunk(this);
    local_13 = BVar1 != 0;
  }
  return (BOOL)local_13;
}

Assistant:

BOOL FunctionBody::IsInterpreterThunk() const
    {
        bool isInterpreterThunk = this->GetOriginalEntryPoint_Unchecked() == DefaultEntryThunk;
#if DYNAMIC_INTERPRETER_THUNK
        bool isStaticInterpreterThunk = this->GetOriginalEntryPoint_Unchecked() == InterpreterStackFrame::StaticInterpreterThunk;
        isInterpreterThunk = isInterpreterThunk || isStaticInterpreterThunk || IsDynamicInterpreterThunk();
#endif
        return isInterpreterThunk;
    }